

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result *
pugi::impl::anon_unknown_0::load_file_impl
          (xml_document_struct *doc,FILE *file,uint options,xml_encoding encoding,
          char_t **out_buffer)

{
  xml_parse_status options_00;
  xml_encoding encoding_00;
  void *__ptr;
  size_t sVar1;
  undefined4 in_ECX;
  FILE *in_RDX;
  xml_parse_result *in_RDI;
  undefined4 in_R8D;
  void *in_R9;
  xml_encoding unaff_retaddr;
  undefined4 unaff_retaddr_00;
  FILE *in_stack_00000008;
  char_t **in_stack_00000018;
  xml_encoding real_encoding;
  size_t read_size;
  char *contents;
  size_t max_suffix_size;
  xml_parse_status size_status;
  size_t size;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  size_t __n;
  
  if (in_RDX == (FILE *)0x0) {
    make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    __n = 0;
    options_00 = get_file_size(in_stack_00000008,(size_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr))
    ;
    if (options_00 == status_ok) {
      __ptr = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                                allocate)(__n + 1);
      if (__ptr == (void *)0x0) {
        make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      else {
        sVar1 = fread(__ptr,1,__n,in_RDX);
        if (sVar1 == __n) {
          encoding_00 = get_buffer_encoding((xml_encoding)in_stack_ffffffffffffff80,
                                            (void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                             in_stack_ffffffffffffff78),
                                            CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70));
          zero_terminate_buffer(__ptr,__n,encoding_00);
          load_buffer_impl((xml_document_struct *)in_RDX,(xml_node_struct *)CONCAT44(in_ECX,in_R8D),
                           in_R9,__n,options_00,unaff_retaddr,(bool)in_stack_ffffffffffffffd3,
                           (bool)in_stack_ffffffffffffffd2,in_stack_00000018);
        }
        else {
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    (__ptr);
          make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
      }
    }
    else {
      make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN xml_parse_result load_file_impl(xml_document_struct* doc, FILE* file, unsigned int options, xml_encoding encoding, char_t** out_buffer)
	{
		if (!file) return make_parse_result(status_file_not_found);

		// get file size (can result in I/O errors)
		size_t size = 0;
		xml_parse_status size_status = get_file_size(file, size);
		if (size_status != status_ok) return make_parse_result(size_status);

		size_t max_suffix_size = sizeof(char_t);

		// allocate buffer for the whole file
		char* contents = static_cast<char*>(xml_memory::allocate(size + max_suffix_size));
		if (!contents) return make_parse_result(status_out_of_memory);

		// read file in memory
		size_t read_size = fread(contents, 1, size, file);

		if (read_size != size)
		{
			xml_memory::deallocate(contents);
			return make_parse_result(status_io_error);
		}

		xml_encoding real_encoding = get_buffer_encoding(encoding, contents, size);

		return load_buffer_impl(doc, doc, contents, zero_terminate_buffer(contents, size, real_encoding), options, real_encoding, true, true, out_buffer);
	}